

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::finish_parse
          (basic_json_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  basic_json_parser<char,_std::allocator<char>_> *in_RDI;
  error_code ec;
  error_code *in_stack_ffffffffffffffa0;
  basic_json_visitor<char> *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar4;
  undefined4 uStack_18;
  undefined4 uStack_14;
  
  std::error_code::error_code(in_stack_ffffffffffffffa0);
  finish_parse(in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe0);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  iVar3 = in_stack_ffffffffffffffe0;
  uVar4 = in_stack_ffffffffffffffe4;
  (*(in_RDI->super_ser_context)._vptr_ser_context[3])();
  ec_00._M_cat._0_4_ = iVar3;
  ec_00._0_8_ = in_stack_ffffffffffffffd8;
  ec_00._M_cat._4_4_ = uVar4;
  ser_error::ser_error
            ((ser_error *)CONCAT44(uStack_14,uStack_18),ec_00,
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffc0
            );
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void finish_parse(basic_json_visitor<char_type>& visitor)
    {
        std::error_code ec;
        finish_parse(visitor, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec,line_,column()));
        }
    }